

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O0

void CreateNewEntry<Assimp::LWO::WeightChannel>
               (vector<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>
                *list,uint srcIdx)

{
  bool bVar1;
  reference chan;
  WeightChannel *elem;
  iterator __end0;
  iterator __begin0;
  vector<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_> *__range1;
  uint srcIdx_local;
  vector<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_> *list_local;
  
  __end0 = std::vector<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>::
           begin(list);
  elem = (WeightChannel *)
         std::vector<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>::end
                   (list);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<Assimp::LWO::WeightChannel_*,_std::vector<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>_>
                                *)&elem);
    if (!bVar1) break;
    chan = __gnu_cxx::
           __normal_iterator<Assimp::LWO::WeightChannel_*,_std::vector<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>_>
           ::operator*(&__end0);
    CreateNewEntry<Assimp::LWO::WeightChannel>(chan,srcIdx);
    __gnu_cxx::
    __normal_iterator<Assimp::LWO::WeightChannel_*,_std::vector<Assimp::LWO::WeightChannel,_std::allocator<Assimp::LWO::WeightChannel>_>_>
    ::operator++(&__end0);
  }
  return;
}

Assistant:

inline void CreateNewEntry(std::vector< T >& list, unsigned int srcIdx)
{
    for (auto &elem : list)   {
        CreateNewEntry( elem, srcIdx );
    }
}